

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O3

void __thiscall jaegertracing::Span::SetOperationName(Span *this,string_view name)

{
  int iVar1;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x148));
  if (iVar1 == 0) {
    if (*(long *)(this + 0xf8) == 0) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,name.data_,name.data_ + name.length_);
      std::__cxx11::string::operator=((string *)(this + 200),(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SetOperationName(opentracing::string_view name) noexcept override
    {
        std::lock_guard<std::mutex> lock(_mutex);
        if (isFinished()) {
            return;
        }
        _operationName = name;
    }